

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O3

bool LTFlightData::CheckDupKey(FDKeyTy *_key,FDKeyType _ty)

{
  const_iterator cVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  FDKeyTy cpyKey;
  
  FDKeyTy::FDKeyTy(&cpyKey,_ty,_key->num);
  cVar1 = std::
          _Rb_tree<LTFlightData::FDKeyTy,_std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>,_std::_Select1st<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
          ::find(&mapFd._M_t,&cpyKey);
  if ((_Rb_tree_header *)cVar1._M_node != &mapFd._M_t._M_impl.super__Rb_tree_header) {
    if ((int)dataRefs.iLogLevel < 1) {
      uVar2 = _key->eKeyType - KEY_OGN;
      pcVar3 = "unknown";
      pcVar4 = "unknown";
      if (uVar2 < 7) {
        pcVar4 = (&PTR_anon_var_dwarf_20b5ba_002dbe10)[uVar2];
      }
      if (cpyKey.eKeyType - KEY_OGN < 7) {
        pcVar3 = (&PTR_anon_var_dwarf_20b5ba_002dbe10)[cpyKey.eKeyType - KEY_OGN];
      }
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTFlightData.cpp"
             ,0x1a6,"CheckDupKey",logDEBUG,
             "Handling same key %s of different types: %s replaced by %s",
             (_key->key)._M_dataplus._M_p,pcVar4,pcVar3);
    }
    _key->eKeyType = cpyKey.eKeyType;
    std::__cxx11::string::operator=((string *)&_key->key,(string *)&cpyKey.key);
    _key->num = cpyKey.num;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cpyKey.key._M_dataplus._M_p != &cpyKey.key.field_2) {
    operator_delete(cpyKey.key._M_dataplus._M_p,cpyKey.key.field_2._M_allocated_capacity + 1);
  }
  return (_Rb_tree_header *)cVar1._M_node != &mapFd._M_t._M_impl.super__Rb_tree_header;
}

Assistant:

bool LTFlightData::CheckDupKey(LTFlightData::FDKeyTy& _key, LTFlightData::FDKeyType _ty)
{
    LTFlightData::FDKeyTy cpyKey(_ty, _key.num);
    if (mapFd.count(cpyKey) > 0) {
        LOG_MSG(logDEBUG, "Handling same key %s of different types: %s replaced by %s",
                _key.c_str(), _key.GetKeyTypeText(), cpyKey.GetKeyTypeText());
        _key = std::move(cpyKey);
        return true;
    }
    return false;
}